

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::BoundaryNear(S2Loop *this,S2Loop *b,S1Angle max_error)

{
  bool bVar1;
  int iVar2;
  bool local_42;
  int local_2c;
  int a_offset;
  S2Loop *b_local;
  S2Loop *this_local;
  S1Angle max_error_local;
  
  bVar1 = is_empty_or_full(this);
  if ((!bVar1) && (bVar1 = is_empty_or_full(b), !bVar1)) {
    local_2c = 0;
    while( true ) {
      iVar2 = num_vertices(this);
      if (iVar2 <= local_2c) {
        return false;
      }
      bVar1 = MatchBoundaries(this,b,local_2c,max_error);
      if (bVar1) break;
      local_2c = local_2c + 1;
    }
    return true;
  }
  bVar1 = is_empty(this);
  if ((bVar1) && (bVar1 = is_empty(b), bVar1)) {
    return true;
  }
  bVar1 = is_full(this);
  local_42 = false;
  if (bVar1) {
    local_42 = is_full(b);
  }
  return local_42;
}

Assistant:

bool S2Loop::BoundaryNear(const S2Loop& b, S1Angle max_error) const {
  // Special case to handle empty or full loops.
  if (is_empty_or_full() || b.is_empty_or_full()) {
    return (is_empty() && b.is_empty()) || (is_full() && b.is_full());
  }

  for (int a_offset = 0; a_offset < num_vertices(); ++a_offset) {
    if (MatchBoundaries(*this, b, a_offset, max_error)) return true;
  }
  return false;
}